

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  
  lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar5 + 4) & 0x20) == 0) {
    iVar7 = container1->n_runs;
    lVar5 = (long)iVar7;
    if (0 < lVar5) {
      lVar6 = 0;
      do {
        iVar7 = iVar7 + (uint)container1->runs[lVar6].length;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
  }
  else {
    iVar7 = _avx2_run_container_cardinality(container1);
  }
  iVar4 = container2->cardinality;
  if (iVar4 == -1) {
    iVar4 = bitset_container_compute_cardinality(container2);
  }
  if (iVar4 == iVar7) {
    uVar11 = (ulong)container1->n_runs;
    bVar14 = (long)uVar11 < 1;
    if (0 < (long)uVar11) {
      uVar12 = 0;
      do {
        uVar1 = container1->runs[uVar12].value;
        uVar2 = container1->runs[uVar12].length;
        if (uVar2 == 0) {
          if ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
            return bVar14;
          }
        }
        else {
          uVar10 = (uint)uVar2 + (uint)uVar1 + 1;
          uVar8 = -1L << ((byte)uVar1 & 0x3f);
          uVar9 = uVar10 >> 6;
          uVar13 = -1L << ((byte)uVar10 & 0x3f);
          if (uVar1 >> 6 == uVar9) {
            bVar15 = (uVar8 & ~(uVar13 | container2->words[uVar9])) == 0;
          }
          else {
            puVar3 = container2->words;
            if (puVar3[uVar1 >> 6] < uVar8) {
              return bVar14;
            }
            if (((uint)uVar2 + (uint)uVar1 < 0xffff) &&
               ((uVar13 | puVar3[uVar9]) != 0xffffffffffffffff)) {
              return bVar14;
            }
            uVar8 = (ulong)(uVar1 >> 6);
            while( true ) {
              bVar15 = (ulong)uVar9 <= uVar8 + 1 || 0x3fe < uVar8;
              if (bVar15) break;
              lVar5 = uVar8 + 1;
              uVar8 = uVar8 + 1;
              if (puVar3[lVar5] != 0xffffffffffffffff) {
                return bVar14;
              }
            }
          }
          if (!bVar15) {
            return bVar14;
          }
        }
        uVar12 = uVar12 + 1;
        bVar14 = uVar11 <= uVar12;
      } while (uVar12 != uVar11);
    }
  }
  else {
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {

    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) ?
                      container2->cardinality :
                      bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}